

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

void fprefx(obj *otmp)

{
  ushort uVar1;
  boolean bVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  int tmp;
  int iVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  
  uVar1 = otmp->otyp;
  if (uVar1 < 0x116) {
    if (uVar1 == 0x10d) {
      if (((youmonst.data)->mflags1 & 0x20020000) == 0x20000000) {
        pcVar6 = "That tripe ration was surprisingly good!";
        goto LAB_00192529;
      }
      if (u.umonnum == u.umonster) {
        if (urace.malenum == 0x4a) {
LAB_001924a7:
          pcVar6 = "Tastes great! Less filling!";
          if (u.uprops[0x24].extrinsic != 0 || u.uprops[0x23].intrinsic == 0) {
            pcVar6 = "Mmm, tripe... not bad!";
          }
          if ((u.umonnum != u.umonster &&
               (u.uprops[0x24].extrinsic == 0 && u.uprops[0x23].intrinsic != 0)) &&
             (bVar2 = dmgtype(youmonst.data,0x24), pcVar6 = "Tastes great! Less filling!",
             bVar2 != '\0')) {
            pcVar6 = "Mmm, tripe... not bad!";
          }
          goto LAB_00192529;
        }
      }
      else if (((youmonst.data)->mflags2 & 0x80) != 0) goto LAB_001924a7;
      pline("Yak - dog food!");
      if (urole.malenum == 0x15d) {
        pline("At least it\'s not prison food.");
      }
      more_experienced(1,1,0);
      newexplevel();
      uVar5 = mt_random();
      if ((urole.malenum == 0x15d || (urace.malenum == 0xe8 || urace.malenum == 0x4a)) ||
          (urole.malenum == 0x15b || (uVar5 & 1) == 0)) {
        return;
      }
      lVar9 = (long)victual.reqtime;
      uVar5 = mt_random();
      uVar5 = SUB164(ZEXT416(uVar5) % SEXT816(lVar9),0) + 0xe;
LAB_001921c9:
      bVar2 = '\0';
LAB_001922dd:
      make_vomiting((ulong)uVar5,bVar2);
      return;
    }
    if (uVar1 == 0x10f) {
LAB_00192076:
      if (400 < moves - otmp->age) {
        pline("Ugh.  Rotten egg.");
        if ((urole.malenum != 0x15d) || (uVar5 = mt_random(), (int)(uVar5 & 7) <= u.ulevel)) {
          uVar5 = u.uprops[0x2f].intrinsic;
          iVar8 = 10;
          iVar11 = -10;
          do {
            uVar4 = mt_random();
            iVar8 = iVar8 + (uVar4 & 3);
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0);
          uVar5 = iVar8 + uVar5;
          bVar2 = '\x01';
          goto LAB_001922dd;
        }
        pcVar6 = "You feel a slight stomach ache.";
        goto LAB_00192529;
      }
    }
    goto switchD_0019200a_caseD_117;
  }
  switch(uVar1) {
  case 0x116:
  case 0x118:
    break;
  case 0x117:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
    goto switchD_0019200a_caseD_117;
  case 0x11d:
    if (((youmonst.data)->mflags2 & 2) != 0) {
      lVar9 = (long)victual.reqtime;
      uVar5 = mt_random();
      uVar5 = SUB164(ZEXT416(uVar5) % SEXT816(lVar9),0) + 5;
      goto LAB_001921c9;
    }
    if (uVar1 < 0x118) {
      if (uVar1 == 0x10f) goto LAB_00192076;
LAB_001923aa:
      if (uVar1 != 0x116) goto switchD_0019200a_caseD_117;
    }
    else if (uVar1 != 0x118) {
      if (uVar1 == 0x11e) goto switchD_0019200a_caseD_11e;
      goto switchD_0019200a_caseD_117;
    }
    break;
  case 0x11e:
switchD_0019200a_caseD_11e:
    if (((otmp->field_0x4a & 1) == 0) && (current_fruit == otmp->spe)) {
      pcVar6 = "yummy";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar6 = "primo";
        }
        else {
          bVar2 = dmgtype(youmonst.data,0x24);
          pcVar6 = "yummy";
          if (bVar2 == '\0') {
            pcVar6 = "primo";
          }
        }
      }
      pcVar7 = singular(otmp,xname);
      pcVar10 = "My, that was a %s %s!";
      goto LAB_00192457;
    }
    if (uVar1 == 0x10f) goto LAB_00192076;
    if (uVar1 != 0x118) goto LAB_001923aa;
    break;
  default:
    if (uVar1 == 0x126) {
      if (200 < u.uhunger) {
        if (700 < u.uhunger) {
          return;
        }
        pcVar6 = body_part(0x12);
        pline("That satiated your %s!",pcVar6);
        return;
      }
      pcVar6 = "That food really hit the spot!";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar6 = "Oh wow, like, superior, man!";
        }
        else {
          bVar2 = dmgtype(youmonst.data,0x24);
          pcVar6 = "That food really hit the spot!";
          if (bVar2 == '\0') {
            pcVar6 = "Oh wow, like, superior, man!";
          }
        }
      }
      goto LAB_00192529;
    }
switchD_0019200a_caseD_117:
    pcVar6 = singular(otmp,xname);
    if ((otmp->field_0x4a & 1) == 0) {
      uVar5 = (ushort)otmp->otyp - 0x125;
      if ((uVar5 < 4) && (uVar5 != 1)) {
        pcVar7 = "bland.";
      }
      else {
        pcVar7 = "delicious!";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum != u.umonster) {
            cVar3 = dmgtype(youmonst.data,0x24);
            pcVar10 = "gnarly!";
            pcVar7 = "delicious!";
            goto LAB_00192449;
          }
          pcVar7 = "gnarly!";
        }
      }
    }
    else {
      pcVar7 = "terrible!";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar7 = "grody!";
        }
        else {
          cVar3 = dmgtype(youmonst.data,0x24);
          pcVar10 = "grody!";
          pcVar7 = "terrible!";
LAB_00192449:
          if (cVar3 == '\0') {
            pcVar7 = pcVar10;
          }
        }
      }
    }
    pcVar10 = "This %s is %s";
LAB_00192457:
    pline(pcVar10,pcVar6,pcVar7);
    return;
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
    pcVar6 = "Core dumped.";
  }
  else {
    uVar5 = mt_random();
    if (uVar5 % 100 < 0x4b) {
      pcVar6 = "Segmentation fault -- core dumped.";
    }
    else if (uVar5 % 100 < 99) {
      pcVar6 = "Bus error -- core dumped.";
    }
    else {
      pcVar6 = "Yo\' mama -- core dumped.";
    }
  }
LAB_00192529:
  pline(pcVar6);
  return;
}

Assistant:

static void fprefx(struct obj *otmp)
{
	switch(otmp->otyp) {
	    case FOOD_RATION:
		if (u.uhunger <= 200)
		    pline(Hallucination ? "Oh wow, like, superior, man!" :
			  "That food really hit the spot!");
		else if (u.uhunger <= 700) pline("That satiated your %s!",
						body_part(STOMACH));
		break;
	    case TRIPE_RATION:
		if (carnivorous(youmonst.data) && !humanoid(youmonst.data))
		    pline("That tripe ration was surprisingly good!");
		else if (maybe_polyd(is_orc(youmonst.data), Race_if (PM_ORC)))
		    pline(Hallucination ? "Tastes great! Less filling!" :
			  "Mmm, tripe... not bad!");
		else {
		    pline("Yak - dog food!");
		    if (Role_if(PM_CONVICT))
			pline("At least it's not prison food.");
		    more_experienced(1, 1, 0);
		    newexplevel();
		    /* not cannibalism, but we use similar criteria
		       for deciding whether to be sickened by this meal */
		    if (rn2(2) && !CANNIBAL_ALLOWED() && !Role_if(PM_CONVICT))
			make_vomiting((long)rn1(victual.reqtime, 14), FALSE);
		}
		break;
	    case MEATBALL:
	    case MEAT_STICK:
	    case HUGE_CHUNK_OF_MEAT:
	    case MEAT_RING:
		goto give_feedback;
	     /* break; */
	    case CLOVE_OF_GARLIC:
		if (is_undead(youmonst.data)) {
			make_vomiting((long)rn1(victual.reqtime, 5), FALSE);
			break;
		}
		/* Fall through otherwise */
	    default:
		if (otmp->otyp==SLIME_MOLD && !otmp->cursed
			&& otmp->spe == current_fruit)
		    pline("My, that was a %s %s!",
			  Hallucination ? "primo" : "yummy",
			  singular(otmp, xname));
		else
#ifdef UNIX
		if (otmp->otyp == APPLE || otmp->otyp == PEAR) {
		    if (!Hallucination) pline("Core dumped.");
		    else {
/* This is based on an old Usenet joke, a fake a.out manual page */
			int x = rnd(100);
			if (x <= 75)
			    pline("Segmentation fault -- core dumped.");
			else if (x <= 99)
			    pline("Bus error -- core dumped.");
			else pline("Yo' mama -- core dumped.");
		    }
		} else
#endif
		if (otmp->otyp == EGG && stale_egg(otmp)) {
		    pline("Ugh.  Rotten egg.");	/* perhaps others like it */
		    /* prisoners are used to bad food */
		    if (Role_if(PM_CONVICT) && rn2(8) > u.ulevel)
			pline("You feel a slight stomach ache.");
		    else
			make_vomiting(Vomiting + dice(10,4), TRUE);
		} else
 give_feedback:
		    pline("This %s is %s", singular(otmp, xname),
		      otmp->cursed ? (Hallucination ? "grody!" : "terrible!") :
		      (otmp->otyp == CRAM_RATION
		      || otmp->otyp == K_RATION
		      || otmp->otyp == C_RATION)
		      ? "bland." :
		      Hallucination ? "gnarly!" : "delicious!");
		break;
	}
}